

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

void sx__job_selector_fn(sx_fiber_transfer transfer)

{
  code *pcVar1;
  long *plVar2;
  sx__job *job;
  sx_job_context *ctx;
  sx__job_select_result sVar3;
  sx_fiber_transfer sVar4;
  
  ctx = (sx_job_context *)transfer.user;
  plVar2 = (long *)sx_tls_get(ctx->thread_tls);
  if (plVar2 == (long *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0xf6,"tdata");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if (ctx->quit == 0) {
    do {
      sx_semaphore_wait(&ctx->sem,-1);
      sVar3 = sx__job_select(ctx,*(uint32_t *)((long)plVar2 + 0x24),*(uint32_t *)(plVar2 + 5));
      job = sVar3.job;
      if (job == (sx__job *)0x0) {
        if (((undefined1  [16])sVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          sx_semaphore_post(&ctx->sem,1);
        }
      }
      else {
        if (job->owner_tid != 0) {
          if (*plVar2 != 0) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                              ,0x102,"tdata->cur_job == NULL");
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          job->owner_tid = 0;
        }
        plVar2[3] = (long)job->selector_fiber;
        *plVar2 = (long)job;
        sVar4 = sx_fiber_switch(job->fiber,job);
        job->fiber = sVar4.from;
        if (job->done != 0) {
          *plVar2 = 0;
          LOCK();
          *job->counter = *job->counter - 1;
          UNLOCK();
          sx__del_job(ctx,job);
        }
      }
    } while (ctx->quit == 0);
  }
  sx_fiber_switch(transfer.from,ctx);
  return;
}

Assistant:

static void sx__job_selector_fn(sx_fiber_transfer transfer)
{
    sx_job_context* ctx = (sx_job_context*)transfer.user;
    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);
    sx_assert(tdata);

    while (!ctx->quit) {
        sx_semaphore_wait(&ctx->sem, -1);    // Wait for a job

        // Select the best job in the waiting list
        sx__job_select_result r = sx__job_select(ctx, tdata->tid, tdata->tags);

        //
        if (r.job) {
            // Job is a slave (in wait mode), get back to it and remove slave mode
            if (r.job->owner_tid > 0) {
                sx_assert(tdata->cur_job == NULL);
                r.job->owner_tid = 0;
            }

            // Run the job from beginning, or continue after 'wait'
            tdata->selector_fiber = r.job->selector_fiber;
            tdata->cur_job = r.job;
            r.job->fiber = sx_fiber_switch(r.job->fiber, r.job).from;

            // Delete the job and decrement job counter if it's done
            if (r.job->done) {
                tdata->cur_job = NULL;
                sx_atomic_fetch_sub32(r.job->counter, 1);
                sx__del_job(ctx, r.job);
            }
        } else if (r.waiting_list_alive) {
            // If we have a pending job, continue this loop one more time
            sx_semaphore_post(&ctx->sem, 1);
            sx_relax_cpu();
        }
    }

    // Back to caller thread
    sx_fiber_switch(transfer.from, transfer.user);
}